

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContextTests.cpp
# Opt level: O0

void __thiscall
solitaire::ContextTests_throwOnInvalidFoundationPileColliderId_Test::TestBody
          (ContextTests_throwOnInvalidFoundationPileColliderId_Test *this)

{
  bool bVar1;
  pointer pCVar2;
  char *pcVar3;
  type pCVar4;
  AssertHelper local_100;
  Message local_f8 [2];
  runtime_error *anon_var_0_1;
  type e_1;
  undefined1 auStack_b8 [7];
  bool gtest_caught_expected_1;
  TrueWithString gtest_msg_1;
  AssertHelper local_90;
  Message local_88 [2];
  runtime_error *anon_var_0;
  type e;
  byte local_45;
  bool gtest_caught_expected;
  undefined1 auStack_38 [8];
  TrueWithString gtest_msg;
  ContextTests_throwOnInvalidFoundationPileColliderId_Test *this_local;
  
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_38 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_38);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_38);
  if (bVar1) {
    local_45 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      pCVar2 = std::unique_ptr<solitaire::Context,_std::default_delete<solitaire::Context>_>::
               operator->(&(this->super_ContextTests).context);
      piles::PileId::PileId((PileId *)((long)&e + 4),&(anonymous_namespace)::foundationPilesCount);
      (*(pCVar2->super_Context)._vptr_Context[6])(pCVar2,(PileId *)((long)&e + 4));
    }
    if ((local_45 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)auStack_38,
                 "Expected: context->getFoundationPileCollider(PileId {foundationPilesCount}) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
                );
      goto LAB_0019aec2;
    }
  }
  else {
LAB_0019aec2:
    testing::Message::Message(local_88);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/ContextTests.cpp"
               ,0x53,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(local_88);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_38);
  gtest_msg_1.value._M_string_length = 0;
  gtest_msg_1.value.field_2._M_allocated_capacity = 0;
  auStack_b8[0] = (_Alloc_hider)0x0;
  stack0xffffffffffffff49 = 0;
  gtest_msg_1.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_1.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_b8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_b8);
  if (bVar1) {
    e_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      pCVar4 = std::unique_ptr<solitaire::Context,_std::default_delete<solitaire::Context>_>::
               operator*(&(this->super_ContextTests).context);
      piles::PileId::PileId((PileId *)&e_1,&(anonymous_namespace)::foundationPilesCount);
      (*(pCVar4->super_Context)._vptr_Context[7])(pCVar4,(PileId *)&e_1);
    }
    if ((e_1._7_1_ & 1) != 0) goto LAB_0019b297;
    std::__cxx11::string::operator=
              ((string *)auStack_b8,
               "Expected: std::as_const(*context).getFoundationPileCollider(PileId {foundationPilesCount}) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_f8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_100,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/ContextTests.cpp"
             ,0x58,pcVar3);
  testing::internal::AssertHelper::operator=(&local_100,local_f8);
  testing::internal::AssertHelper::~AssertHelper(&local_100);
  testing::Message::~Message(local_f8);
LAB_0019b297:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_b8);
  return;
}

Assistant:

TEST_F(ContextTests, throwOnInvalidFoundationPileColliderId) {
    EXPECT_THROW(
        context->getFoundationPileCollider(PileId {foundationPilesCount}),
        std::runtime_error
    );

    EXPECT_THROW(
        std::as_const(*context).getFoundationPileCollider(PileId {foundationPilesCount}),
        std::runtime_error
    );
}